

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_2,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  int col;
  long lVar4;
  bool bVar5;
  float v;
  float fVar6;
  undefined4 uVar7;
  Vector<float,_2> res;
  float local_44 [5];
  float local_30 [6];
  Mat2 m;
  
  pfVar1 = (float *)&m;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar4) {
        uVar7 = 0;
      }
      pfVar1[lVar4 * 2] = (float)uVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pfVar1 = pfVar1 + 1;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  pVVar2 = (Vector<float,_2> *)&m;
  m.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  m.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  lVar3 = 0;
  do {
    fVar6 = 0.0;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + ((Vector<tcu::Vector<float,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[lVar4]
                      * local_30[lVar4 + -2];
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    res.m_data[lVar3] = fVar6;
    pVVar2 = pVVar2 + 1;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  local_30[2] = 0.0;
  local_30[3] = 1.4013e-45;
  local_30[4] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_30[lVar3]] = res.m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }